

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  uint *puVar1;
  uint uVar2;
  PGroup *pPVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  u64 uVar8;
  ulong uVar9;
  long lVar10;
  u64 n;
  uint uVar11;
  PgHdr1 *pPVar12;
  
  pPVar3 = pCache->pGroup;
  uVar6 = pCache->nPage;
  if (createFlag == 1) {
    uVar2 = pCache->nRecyclable;
    uVar11 = uVar6 - uVar2;
    if (pPVar3->mxPinned <= uVar11) {
      return (PgHdr1 *)0x0;
    }
    if (pCache->n90pct <= uVar11) {
      return (PgHdr1 *)0x0;
    }
    iVar4 = pcache1UnderMemoryPressure(pCache);
    if (iVar4 != 0 && uVar2 < uVar11) {
      return (PgHdr1 *)0x0;
    }
  }
  if (pCache->nHash <= uVar6) {
    pcache1ResizeHash(pCache);
  }
  if (((pCache->bPurgeable != 0) && (pPVar12 = (pPVar3->lru).pLruPrev, pPVar12->isAnchor == '\0'))
     && ((pCache->nMax <= pCache->nPage + 1 ||
         (iVar4 = pcache1UnderMemoryPressure(pCache), iVar4 != 0)))) {
    pcache1RemoveFromHash(pPVar12,0);
    pcache1PinPage(pPVar12);
    if (pPVar12->pCache->szAlloc == pCache->szAlloc) {
      pPVar3->nCurrentPage =
           pPVar3->nCurrentPage + (pCache->bPurgeable - pPVar12->pCache->bPurgeable);
      goto LAB_00172e4c;
    }
    pcache1FreePage(pPVar12);
  }
  pPVar12 = pCache->pFree;
  if (pPVar12 == (PgHdr1 *)0x0) {
    if (((pCache->nPage == 0) && (pcache1_g.nInitPage != 0)) && (2 < pCache->nMax)) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      if (pcache1_g.nInitPage < 1) {
        uVar8 = (long)pcache1_g.nInitPage * -0x400;
        lVar10 = (long)pCache->szAlloc;
      }
      else {
        lVar10 = (long)pCache->szAlloc;
        uVar8 = (ulong)(uint)pcache1_g.nInitPage * lVar10;
      }
      n = (ulong)pCache->nMax * lVar10;
      if ((long)uVar8 < (long)n) {
        n = uVar8;
      }
      pvVar7 = sqlite3Malloc(n);
      pCache->pBulk = pvVar7;
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pvVar7 == (void *)0x0) {
        pPVar12 = pCache->pFree;
        if (pPVar12 == (PgHdr1 *)0x0) goto LAB_00172df0;
      }
      else {
        iVar5 = (*sqlite3Config.m.xSize)(pvVar7);
        iVar4 = pCache->szAlloc;
        uVar9 = (long)iVar5 / (long)iVar4 & 0xffffffff;
        lVar10 = (long)pCache->szPage;
        pPVar12 = pCache->pFree;
        do {
          *(void **)((long)pvVar7 + lVar10) = pvVar7;
          *(long *)((long)pvVar7 + lVar10 + 8) = (long)pvVar7 + lVar10 + 0x38;
          *(undefined2 *)((long)pvVar7 + lVar10 + 0x15) = 1;
          *(PgHdr1 **)((long)pvVar7 + lVar10 + 0x18) = pPVar12;
          pPVar12 = (PgHdr1 *)((long)pvVar7 + lVar10);
          pvVar7 = (void *)((long)pvVar7 + (long)iVar4);
          uVar6 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar6;
        } while (uVar6 != 0);
        pPVar12 = (PgHdr1 *)((long)pvVar7 + (lVar10 - iVar4));
      }
      goto LAB_00172dd6;
    }
LAB_00172df0:
    if ((createFlag == 1) && (sqlite3Hooks_0 != (code *)0x0)) {
      (*sqlite3Hooks_0)();
    }
    pvVar7 = pcache1Alloc(pCache->szAlloc);
    iVar4 = pCache->szPage;
    if ((createFlag == 1) && (sqlite3Hooks_1 != (code *)0x0)) {
      (*sqlite3Hooks_1)();
    }
    if (pvVar7 == (void *)0x0) {
      return (PgHdr1 *)0x0;
    }
    pPVar12 = (PgHdr1 *)((long)iVar4 + (long)pvVar7);
    (pPVar12->page).pBuf = pvVar7;
    (pPVar12->page).pExtra = pPVar12 + 1;
    pPVar12->isBulkLocal = '\0';
    pPVar12->isAnchor = '\0';
  }
  else {
LAB_00172dd6:
    pCache->pFree = pPVar12->pNext;
    pPVar12->pNext = (PgHdr1 *)0x0;
  }
  if (pCache->bPurgeable != 0) {
    puVar1 = &pCache->pGroup->nCurrentPage;
    *puVar1 = *puVar1 + 1;
  }
LAB_00172e4c:
  uVar9 = (ulong)iKey % (ulong)pCache->nHash;
  pCache->nPage = pCache->nPage + 1;
  pPVar12->iKey = iKey;
  pPVar12->pNext = pCache->apHash[uVar9];
  pPVar12->pCache = pCache;
  pPVar12->pLruNext = (PgHdr1 *)0x0;
  pPVar12->pLruPrev = (PgHdr1 *)0x0;
  pPVar12->isPinned = '\x01';
  *(undefined8 *)(pPVar12->page).pExtra = 0;
  pCache->apHash[uVar9] = pPVar12;
  if (pCache->iMaxKey < iKey) {
    pCache->iMaxKey = iKey;
  }
  return pPVar12;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache, 
  unsigned int iKey, 
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( pPage->isPinned==0 );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nCurrentPage -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found, 
  ** attempt to allocate a new one. 
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruPrev = 0;
    pPage->pLruNext = 0;
    pPage->isPinned = 1;
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}